

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O3

void __thiscall lf::base::Timer::Resume(Timer *this)

{
  nanoseconds *pnVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (this->is_stopped_ == true) {
    lVar2 = (this->times_).system.__r;
    this->is_stopped_ = false;
    lVar3 = (this->times_).wall.__r;
    lVar4 = (this->times_).user.__r;
    anon_unknown.dwarf_754f7::get_cpu_times(&this->times_);
    (this->times_).wall.__r = (this->times_).wall.__r - lVar3;
    (this->times_).user.__r = (this->times_).user.__r - lVar4;
    pnVar1 = &(this->times_).system;
    pnVar1->__r = pnVar1->__r - lVar2;
  }
  return;
}

Assistant:

void Timer::Resume() noexcept {
  if (IsStopped()) {
    const cpu_times current(times_);
    Start();
    times_.wall -= current.wall;
    times_.user -= current.user;
    times_.system -= current.system;
  }
}